

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void pugi::impl::anon_unknown_0::text_output_indent
               (xml_buffered_writer *writer,char_t *indent,size_t indent_length,uint depth)

{
  uint in_ECX;
  uint *__n;
  void *in_RDX;
  void *extraout_RDX;
  char *in_RSI;
  xml_buffered_writer *in_RDI;
  uint i_4;
  uint i_3;
  uint i_2;
  uint i_1;
  uint i;
  uint uVar1;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  
  __n = &switchD_0015bf9f::switchdataD_001708d8;
  switch(in_RDX) {
  case (void *)0x1:
    for (uVar1 = 0; uVar1 < in_ECX; uVar1 = uVar1 + 1) {
      xml_buffered_writer::write(in_RDI,(int)*in_RSI,in_RDX,(size_t)__n);
      in_RDX = extraout_RDX;
    }
    break;
  case (void *)0x2:
    for (uVar1 = 0; uVar1 < in_ECX; uVar1 = uVar1 + 1) {
      __n = (uint *)CONCAT71((int7)((ulong)__n >> 8),*in_RSI);
      xml_buffered_writer::write
                (in_RDI,(int)*in_RSI,(void *)(ulong)(uint)(int)in_RSI[1],(size_t)__n);
    }
    break;
  case (void *)0x3:
    for (uVar1 = 0; uVar1 < in_ECX; uVar1 = uVar1 + 1) {
      xml_buffered_writer::write
                (in_RDI,(int)*in_RSI,(void *)(ulong)(uint)(int)in_RSI[1],(ulong)(uint)(int)in_RSI[2]
                );
    }
    break;
  case (void *)0x4:
    for (uVar1 = 0; uVar1 < in_ECX; uVar1 = uVar1 + 1) {
      xml_buffered_writer::write
                (in_RDI,(int)*in_RSI,(void *)(ulong)(uint)(int)in_RSI[1],(ulong)(uint)(int)in_RSI[2]
                );
    }
    break;
  default:
    for (uVar1 = 0; uVar1 < in_ECX; uVar1 = uVar1 + 1) {
      xml_buffered_writer::write_buffer
                ((xml_buffered_writer *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                 (char_t *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                 CONCAT44(in_stack_ffffffffffffffd4,uVar1));
    }
  }
  return;
}

Assistant:

PUGI_IMPL_FN void text_output_indent(xml_buffered_writer& writer, const char_t* indent, size_t indent_length, unsigned int depth)
	{
		switch (indent_length)
		{
		case 1:
		{
			for (unsigned int i = 0; i < depth; ++i)
				writer.write(indent[0]);
			break;
		}

		case 2:
		{
			for (unsigned int i = 0; i < depth; ++i)
				writer.write(indent[0], indent[1]);
			break;
		}

		case 3:
		{
			for (unsigned int i = 0; i < depth; ++i)
				writer.write(indent[0], indent[1], indent[2]);
			break;
		}

		case 4:
		{
			for (unsigned int i = 0; i < depth; ++i)
				writer.write(indent[0], indent[1], indent[2], indent[3]);
			break;
		}

		default:
		{
			for (unsigned int i = 0; i < depth; ++i)
				writer.write_buffer(indent, indent_length);
		}
		}
	}